

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpAggregator.cpp
# Opt level: O2

void __thiscall
HighsLpAggregator::getCurrentAggregation
          (HighsLpAggregator *this,vector<int,_std::allocator<int>_> *inds,
          vector<double,_std::allocator<double>_> *vals,bool negate)

{
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pHVar5;
  pointer piVar6;
  pointer pdVar7;
  size_type __new_size;
  ulong uVar8;
  ulong uVar9;
  
  pHVar5 = (this->vectorsum).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar1 = (this->lprelaxation->mipsolver->options_mip_->super_HighsOptionsStruct).small_matrix_value
  ;
  iVar2 = (this->lprelaxation->lpsolver).model_.lp_.num_col_;
  this_00 = &(this->vectorsum).nonzeroinds;
  piVar6 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >> 2;
  uVar9 = uVar8 & 0xffffffff;
  while( true ) {
    __new_size = (size_type)(int)uVar8;
    if ((int)uVar9 < 1) break;
    iVar3 = piVar6[uVar9 - 1];
    uVar9 = uVar9 - 1;
    if ((iVar3 < iVar2) && (ABS(pHVar5[iVar3].hi + pHVar5[iVar3].lo) <= dVar1)) {
      uVar8 = (ulong)((int)uVar8 - 1);
      pHVar5[iVar3].hi = 0.0;
      pHVar5[iVar3].lo = 0.0;
      iVar4 = piVar6[__new_size - 1];
      piVar6[__new_size - 1] = iVar3;
      piVar6[uVar9] = iVar4;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  std::vector<int,_std::allocator<int>_>::operator=(inds,this_00);
  uVar8 = (ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  std::vector<double,_std::allocator<double>_>::resize(vals,(long)(int)uVar8);
  piVar6 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pHVar5 = (this->vectorsum).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar7 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = uVar8 & 0xffffffff;
  uVar9 = 0;
  if (negate) {
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar2 = piVar6[uVar9];
      pdVar7[uVar9] = -(pHVar5[iVar2].hi + pHVar5[iVar2].lo);
    }
  }
  else {
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar2 = piVar6[uVar9];
      pdVar7[uVar9] = pHVar5[iVar2].hi + pHVar5[iVar2].lo;
    }
  }
  return;
}

Assistant:

void HighsLpAggregator::getCurrentAggregation(std::vector<HighsInt>& inds,
                                              std::vector<double>& vals,
                                              bool negate) {
  const double droptol =
      lprelaxation.getMipSolver().options_mip_->small_matrix_value;
  const HighsInt numCol = lprelaxation.numCols();
  vectorsum.cleanup([droptol, numCol](HighsInt col, double val) {
    // only drop values for columns and not for slack variables of rows as the
    // former are the only ones which might be subject to numerical error. The
    // values for row slack variables are exact copies of the weights used
    // (assuming that separators only add each row once). Also all the
    // separators will only allow rows that do have meaningful coefficient
    // contributions with the used weight
    return col < numCol && std::fabs(val) <= droptol;
  });

  inds = vectorsum.getNonzeros();
  HighsInt len = inds.size();
  vals.resize(len);

  if (negate)
    for (HighsInt i = 0; i != len; ++i) vals[i] = -vectorsum.getValue(inds[i]);
  else
    for (HighsInt i = 0; i != len; ++i) vals[i] = vectorsum.getValue(inds[i]);
}